

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O2

void Cfffiou(int unit,int *status)

{
  int i;
  long lVar1;
  
  if (*status < 1) {
    if (unit != -1) {
      if (unit - 10000U < 0xffffd8f1) {
        *status = 0x72;
        ffpmsg("Cfffiou was sent an unacceptable unit number.");
        return;
      }
      gFitsFiles[(uint)unit] = (fitsfile *)0x0;
      return;
    }
    for (lVar1 = 0x32; lVar1 != 10000; lVar1 = lVar1 + 1) {
      gFitsFiles[lVar1] = (fitsfile *)0x0;
    }
  }
  return;
}

Assistant:

void Cfffiou( int unit, int *status )
{
   if( *status>0 ) return;
   FFLOCK;
   if( unit == -1 ) {
      int i; for( i=50; i<NMAXFILES; ) gFitsFiles[i++]=NULL;
   } else if( unit<1 || unit>=NMAXFILES ) {
      *status = BAD_FILEPTR;
      ffpmsg("Cfffiou was sent an unacceptable unit number.");
   } else gFitsFiles[unit]=NULL;
   FFUNLOCK;
}